

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O2

void track_char(CHAR_DATA *ch,CHAR_DATA *mob)

{
  short sVar1;
  TRACK_DATA *pTVar2;
  bool bVar3;
  long lVar4;
  
  if (mob->in_room != (ROOM_INDEX_DATA *)0x0) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      pTVar2 = mob->in_room->tracks[lVar4];
      if ((pTVar2 != (TRACK_DATA *)0x0) && (pTVar2->prey == ch)) {
        sVar1 = pTVar2->direction;
        bVar3 = is_affected_by(mob,0x12);
        if (bVar3) {
          return;
        }
        if ((mob->act[0] & 2) != 0) {
          return;
        }
        act("$n checks the ground for tracks.",mob,(void *)0x0,(void *)0x0,0);
        if ((mob->off_flags[0] & 0x400000) != 0) {
          return;
        }
        if (sVar1 == -1) {
          return;
        }
        move_char(mob,(int)sVar1,false,true);
        return;
      }
    }
  }
  return;
}

Assistant:

void track_char(CHAR_DATA *ch, CHAR_DATA *mob)
{
	if (mob->in_room == nullptr)
		return;

	auto i = 0;
	auto found = false;
	for (; i < MAX_TRACKS; i++)
	{
		if (mob->in_room->tracks[i] && mob->in_room->tracks[i]->prey == ch)
		{
			found = true;
			break;
		}
	}

	if (!found)
		return;

	if (mob->in_room->tracks[i]->prey != ch)
		return;

	auto track_dir = mob->in_room->tracks[i]->direction;

	if (is_affected_by(mob, AFF_CHARM))
		return;

	if (IS_SET(mob->act, ACT_SENTINEL))
		return;

	act("$n checks the ground for tracks.", mob, 0, 0, TO_ROOM);

	if (IS_SET(mob->off_flags, STATIC_TRACKING) || track_dir == -1)
		return;

	auto pexit = mob->in_room->exit[track_dir];

	move_char(mob, track_dir, false, true);
}